

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O0

Value<char16_t> * __thiscall Qentem::Value<char16_t>::operator=(Value<char16_t> *this,char16_t *str)

{
  String<char16_t> local_28;
  char16_t *local_18;
  char16_t *str_local;
  Value<char16_t> *this_local;
  
  local_18 = str;
  str_local = (char16_t *)this;
  reset(this);
  String<char16_t>::String(&local_28,local_18);
  String<char16_t>::operator=((String<char16_t> *)this,&local_28);
  String<char16_t>::~String(&local_28);
  setTypeToString(this);
  return this;
}

Assistant:

Value &operator=(const Char_T *str) {
        reset();
        string_ = StringT{str};
        setTypeToString();

        return *this;
    }